

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O0

int LSetup(N_Vector y,N_Vector f,int jbad,int *jcur,void *mem)

{
  IntegratorMem Imem;
  int retval;
  void *mem_local;
  int *jcur_local;
  int jbad_local;
  N_Vector f_local;
  N_Vector y_local;
  
  if (mem == (void *)0x0) {
    printf("ERROR: Integrator memory is NULL");
    y_local._4_4_ = -1;
  }
  else {
    y_local._4_4_ =
         Jac(0.0,y,(N_Vector)0x0,*(SUNMatrix *)((long)mem + 8),(void *)0x0,(N_Vector)0x0,
             (N_Vector)0x0,(N_Vector)0x0);
    if (y_local._4_4_ == 0) {
      *jcur = 1;
      y_local._4_4_ =
           SUNLinSolSetup(*(SUNLinearSolver *)((long)mem + 0x10),*(SUNMatrix *)((long)mem + 8));
    }
  }
  return y_local._4_4_;
}

Assistant:

int LSetup(N_Vector y, N_Vector f, booleantype jbad, booleantype* jcur, void* mem)
{
  int retval;
  IntegratorMem Imem;

  if (mem == NULL) {
    printf("ERROR: Integrator memory is NULL");
    return(-1);
  }
  Imem = (IntegratorMem) mem;

  /* compute the Jacobian */
  retval = Jac(ZERO, y, NULL, Imem->A, NULL, NULL, NULL, NULL);
  if (retval != 0) return(retval);

  /* update Jacobian status */
  *jcur = SUNTRUE;

  /* setup the linear solver */
  retval = SUNLinSolSetup(Imem->LS, Imem->A);

  return(retval);
}